

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O3

bool __thiscall table::insertcheck(table *this,InsertStatement *stmt)

{
  vector<char_*,_std::allocator<char_*>_> *pvVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  Expr *pEVar4;
  column *pcVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  pointer ppcVar12;
  char *str1;
  size_t sVar13;
  string *str2;
  ulong uVar14;
  long lVar15;
  column *pcVar16;
  pointer ppcVar17;
  ulong uVar18;
  char *pcVar19;
  ulong __val;
  uint __len;
  string __str;
  fstream os;
  char *local_260 [2];
  char local_250 [16];
  string local_240 [16];
  
  pvVar1 = stmt->columns;
  if (pvVar1 == (vector<char_*,_std::allocator<char_*>_> *)0x0) {
    if ((long)(this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
              super__Vector_impl_data._M_start !=
        (long)(stmt->values->super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(stmt->values->super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>).
              _M_impl.super__Vector_impl_data._M_start) {
      pcVar19 = "INSERT has different number of columns than target columns";
      lVar15 = 0x3a;
      goto LAB_0011af96;
    }
  }
  else {
    ppcVar17 = (pvVar1->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    ppcVar2 = (pvVar1->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if ((long)ppcVar2 - (long)ppcVar17 !=
        (long)(stmt->values->super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(stmt->values->super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>).
              _M_impl.super__Vector_impl_data._M_start) {
      pcVar19 = "Column count doesn\'t match value count";
      lVar15 = 0x26;
LAB_0011af96:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar19,lVar15);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
      std::ostream::put('p');
      std::ostream::flush();
      return false;
    }
    if (ppcVar17 != ppcVar2) {
      do {
        pcVar19 = *ppcVar17;
        std::__cxx11::string::string((string *)local_240,pcVar19,(allocator *)local_260);
        ppcVar12 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppcVar3 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl
                  .super__Vector_impl_data._M_finish;
        if (ppcVar12 == ppcVar3) {
          bVar8 = true;
        }
        else {
          do {
            pcVar16 = *ppcVar12;
            bVar8 = util::compareString(&pcVar16->name,local_240);
            if (bVar8) goto LAB_0011a9fa;
            ppcVar12 = ppcVar12 + 1;
          } while (ppcVar12 != ppcVar3);
          pcVar16 = (column *)0x0;
LAB_0011a9fa:
          bVar8 = pcVar16 == (column *)0x0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240[0]._M_dataplus._M_p != &local_240[0].field_2) {
          operator_delete(local_240[0]._M_dataplus._M_p);
        }
        if (bVar8) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Unknown column ",0xf);
          if (pcVar19 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12d270);
          }
          else {
            sVar13 = strlen(pcVar19);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar19,sVar13)
            ;
          }
          pcVar19 = " in table list\'";
          lVar15 = 0xf;
          goto LAB_0011af96;
        }
        ppcVar17 = ppcVar17 + 1;
      } while (ppcVar17 != ppcVar2);
    }
  }
  std::fstream::fstream(local_240,(string *)&this->filename,_S_out|_S_in|_S_bin|_S_app);
  cVar9 = std::__basic_file<char>::is_open();
  if (cVar9 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"cannot open table file",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
LAB_0011b0ad:
    bVar8 = false;
  }
  else {
    ppcVar12 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppcVar12) {
      pcVar16 = this->primaryKey;
      str2 = &pcVar16->name;
      uVar18 = 0;
      do {
        iVar10 = std::__cxx11::string::compare((char *)&ppcVar12[uVar18]->flag);
        pEVar4 = (stmt->values->super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar18];
        if (iVar10 == 0) {
          if (pEVar4->type == kExprLiteralString) {
            pcVar19 = pEVar4->name;
            sVar13 = strlen(pcVar19);
            pcVar5 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar18];
            if ((ulong)(long)pcVar5->element_truesize < sVar13) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Wrong Char size",0xf);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
              std::ostream::put('p');
              std::ostream::flush();
              goto LAB_0011b0ad;
            }
            if ((pcVar16 != (column *)0x0) &&
               (bVar8 = util::compareString(&pcVar5->name,str2), bVar8)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"check primary key values",0x18);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
              std::ostream::put('p');
              std::ostream::flush();
              if (0 < this->rowlength) {
                iVar10 = 0;
                do {
                  std::istream::seekg(local_240,
                                      (long)(this->table_cols).
                                            super__Vector_base<column_*,_std::allocator<column_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start[uVar18]->
                                            col_offset + (long)iVar10 * (long)this->rowSize,0);
                  iVar11 = (this->table_cols).
                           super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar18]->element_truesize;
                  if (iVar11 < 0) {
                    iVar11 = -1;
                  }
                  str1 = (char *)operator_new__((long)iVar11);
                  std::istream::read((char *)local_240,(long)str1);
                  bVar8 = util::compareString(str1,pcVar19);
                  if (bVar8) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "Can\'t insert duplicate values to primary key column",0x33);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
                    std::ostream::put('p');
                    std::ostream::flush();
                    goto LAB_0011b0a5;
                  }
                  iVar10 = iVar10 + 1;
                } while (iVar10 < this->rowlength);
              }
            }
          }
          else {
            uVar6 = pEVar4->ival;
            __val = -uVar6;
            if (0 < (long)uVar6) {
              __val = uVar6;
            }
            __len = 1;
            if (9 < __val) {
              uVar14 = __val;
              uVar7 = 4;
              do {
                __len = uVar7;
                if (uVar14 < 100) {
                  __len = __len - 2;
                  goto LAB_0011ad36;
                }
                if (uVar14 < 1000) {
                  __len = __len - 1;
                  goto LAB_0011ad36;
                }
                if (uVar14 < 10000) goto LAB_0011ad36;
                bVar8 = 99999 < uVar14;
                uVar14 = uVar14 / 10000;
                uVar7 = __len + 4;
              } while (bVar8);
              __len = __len + 1;
            }
LAB_0011ad36:
            local_260[0] = local_250;
            std::__cxx11::string::_M_construct
                      ((ulong)local_260,(char)__len - (char)((long)uVar6 >> 0x3f));
            std::__detail::__to_chars_10_impl<unsigned_long>
                      (local_260[0] + -((long)uVar6 >> 0x3f),__len,__val);
            pcVar19 = local_260[0];
            if (local_260[0] != local_250) {
              operator_delete(local_260[0]);
            }
            sVar13 = strlen(pcVar19);
            pcVar5 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar18];
            if ((ulong)(long)pcVar5->element_truesize < sVar13) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Wrong Char size",0xf);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
              std::ostream::put('p');
              std::ostream::flush();
              goto LAB_0011b0ad;
            }
            if ((pcVar16 != (column *)0x0) &&
               (bVar8 = util::compareString(&pcVar5->name,str2), bVar8 && 0 < this->rowlength)) {
              iVar10 = 0;
              do {
                std::istream::seekg(local_240,
                                    (long)(this->table_cols).
                                          super__Vector_base<column_*,_std::allocator<column_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start[uVar18]->
                                          col_offset + (long)iVar10 * (long)this->rowSize,0);
                iVar11 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar18]->element_truesize;
                if (iVar11 < 0) {
                  iVar11 = -1;
                }
                str1 = (char *)operator_new__((long)iVar11);
                std::istream::read((char *)local_240,(long)str1);
                bVar8 = util::compareString(str1,pcVar19);
                if (bVar8) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "Can\'t insert duplicate values to primary key column",0x33);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
                  std::ostream::put('p');
                  std::ostream::flush();
                  goto LAB_0011b0a5;
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 < this->rowlength);
            }
          }
        }
        else {
          if (pEVar4->type == kExprLiteralString) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"need a int value instead of a string",0x24);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
            std::ostream::put('p');
            std::ostream::flush();
            goto LAB_0011b0ad;
          }
          if ((pcVar16 != (column *)0x0) &&
             (bVar8 = util::compareString(&(this->table_cols).
                                           super__Vector_base<column_*,_std::allocator<column_*>_>.
                                           _M_impl.super__Vector_impl_data._M_start[uVar18]->name,
                                          str2), bVar8 && 0 < this->rowlength)) {
            iVar10 = 0;
            do {
              std::istream::seekg(local_240,
                                  (long)(this->table_cols).
                                        super__Vector_base<column_*,_std::allocator<column_*>_>.
                                        _M_impl.super__Vector_impl_data._M_start[uVar18]->col_offset
                                  + (long)iVar10 * (long)this->rowSize,0);
              iVar11 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar18]->element_truesize;
              if (iVar11 < 0) {
                iVar11 = -1;
              }
              str1 = (char *)operator_new__((long)iVar11);
              std::istream::read((char *)local_240,(long)str1);
              bVar8 = util::compareString(str1,(char *)&(stmt->values->
                                                                                                                
                                                  super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar18]
                                                  ->ival);
              if (bVar8) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "Can\'t insert duplicate values to primary key column",0x33);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
                std::ostream::put('p');
                std::ostream::flush();
LAB_0011b0a5:
                operator_delete(str1);
                goto LAB_0011b0ad;
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < this->rowlength);
          }
        }
        uVar18 = uVar18 + 1;
        ppcVar12 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      } while (uVar18 < (ulong)((long)(this->table_cols).
                                      super__Vector_base<column_*,_std::allocator<column_*>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar12 >>
                               3));
    }
    bVar8 = true;
    std::fstream::close();
  }
  std::fstream::~fstream(local_240);
  return bVar8;
}

Assistant:

bool table::insertcheck(hsql::InsertStatement *stmt) {

    if(stmt->columns != NULL && stmt->columns->size() != stmt->values->size()){
        cout <<"Column count doesn't match value count"<<endl;
        return false;
    }
    if(stmt->columns == NULL && table_cols.size() != stmt->values->size()){
        cout <<"INSERT has different number of columns than target columns"<<endl;
        return false;
    }
    if(stmt->columns != NULL){
        for(char* col_name : *stmt->columns){
            auto it = getColumn(col_name);
            if(it == NULL){
                cout <<"Unknown column "<<col_name<<" in table list'"<<endl;
                return false;
            }
        }
    }
    fstream os(filename, ios::in|ios::out|ios::binary|ios::app);
    if(!os.is_open()){
        cout << "cannot open table file" <<endl;
        return false;
    }

    //check insert type
    column* primary = getPrimaryKey();
    for(int i=0; i < table_cols.size(); i++){

        if(table_cols[i]->flag == "CHAR"){
            if((*stmt->values)[i]->type == hsql::kExprLiteralString){
                const char* str = (*stmt->values)[i]->name ;
                if( strlen(str) > table_cols[i]->element_truesize ){
                    cout << "Wrong Char size" << endl;
                    return false;
                }
                if(primary != nullptr && util::compareString(table_cols[i]->name, primary->name)){
                    cout << "check primary key values"<<endl;
                    for(int j=0 ; j < getRowlength(); j++){
                        os.seekg(j * rowSize + table_cols[i]->col_offset);
                        char *bytes = new char[table_cols[i]->element_truesize];
                        os.read(bytes, table_cols[i]->element_truesize);
                        if(util::compareString(bytes, str)){
                            cout<<"Can't insert duplicate values to primary key column"<<endl;
                            delete bytes;
                            return false;
                        }

                    }
                }

            }
            else{
                const char* str = to_string( (*stmt->values)[i]->ival ).c_str();
                if( strlen(str) > table_cols[i]->element_truesize ){
                    cout << "Wrong Char size" << endl;
                    return false;
                }
                if(primary!=nullptr&&util::compareString(table_cols[i]->name, primary->name)){
                    for(int j=0 ; j < getRowlength(); j++){
                        os.seekg(j * rowSize + table_cols[i]->col_offset);
                        char *bytes = new char[table_cols[i]->element_truesize];
                        os.read(bytes, table_cols[i]->element_truesize);
                        if(util::compareString(bytes, str)){
                            cout<<"Can't insert duplicate values to primary key column"<<endl;
                            delete bytes;
                            return false;
                        }
                    }
                }
            }
        }
        else{
            if((*stmt->values)[i]->type == hsql::kExprLiteralString){
                cout<<"need a int value instead of a string"<<endl;
                return false;
            }
            if(primary!= nullptr && util::compareString(table_cols[i]->name, primary->name)){
                for(int j=0 ; j < getRowlength(); j++){
                    os.seekg(j * rowSize + table_cols[i]->col_offset);
                    char *bytes = new char[table_cols[i]->element_truesize];
                    os.read(bytes, table_cols[i]->element_truesize);
                    //cout  << bytes <<endl;
                    if(util::compareString(bytes, (char*)&(*stmt->values)[i]->ival)){
                        cout<<"Can't insert duplicate values to primary key column"<<endl;
                        delete bytes;
                        return false;
                    }

                }
            }

        }
    }
    os.close();

    return true;
}